

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

ulong __thiscall smf::MidiFile::readVLValue(MidiFile *this,istream *input)

{
  uchar uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  uchar b [5];
  uchar local_20 [8];
  
  local_20[4] = '\0';
  local_20[0] = '\0';
  local_20[1] = '\0';
  local_20[2] = '\0';
  local_20[3] = '\0';
  lVar3 = 0;
  do {
    uVar1 = readByte(this,input);
    local_20[lVar3] = uVar1;
    if (this->m_rwstatus == false) {
      return 0;
    }
  } while (((char)uVar1 < '\0') && (bVar4 = lVar3 != 4, lVar3 = lVar3 + 1, bVar4));
  uVar2 = unpackVLV(this,local_20[0],local_20[1],local_20[2],local_20[3],local_20[4]);
  return uVar2;
}

Assistant:

ulong MidiFile::readVLValue(std::istream& input) {
	uchar b[5] = {0};

    for (uchar &item : b) {
            item = readByte(input);
            if (!status()) {
                    return m_rwstatus;
            }
            if (item < 0x80) {
                    break;
            }
    }

    return unpackVLV(b[0], b[1], b[2], b[3], b[4]);
}